

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int valid_nifti_brick_list(nifti_image *nim,int nbricks,int *blist,int disp_error)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  if (nim == (nifti_image *)0x0) {
    if ((disp_error == 0) && (g_opts_0 < 1)) {
      return 0;
    }
    valid_nifti_brick_list_cold_3();
    return 0;
  }
  if (nbricks < 1 || blist == (int *)0x0) {
    if ((disp_error == 0) && (g_opts_0 < 2)) {
      return 0;
    }
    valid_nifti_brick_list_cold_1();
    return 0;
  }
  uVar1 = nim->dim[0];
  if ((int)uVar1 < 3) {
    if ((disp_error != 0) || (1 < g_opts_0)) {
      fprintf(_stderr,"** cannot read explict brick list from %d-D dataset\n",(ulong)uVar1);
      return 0;
    }
LAB_001065db:
    iVar3 = 0;
  }
  else {
    uVar4 = 1;
    if (uVar1 != 3) {
      lVar5 = 0;
      do {
        uVar4 = uVar4 * nim->dim[lVar5 + 4];
        lVar5 = lVar5 + 1;
      } while ((ulong)uVar1 - 3 != lVar5);
      if ((int)uVar4 < 1) {
        valid_nifti_brick_list_cold_2();
        goto LAB_001065db;
      }
    }
    uVar2 = 0;
    do {
      if (uVar4 <= (uint)blist[uVar2]) {
        if ((disp_error != 0) || (1 < g_opts_0)) {
          fprintf(_stderr,"** volume index %d (#%d) is out of range [0,%d]\n",
                  (ulong)(uint)blist[uVar2],uVar2 & 0xffffffff,(ulong)(uVar4 - 1));
          return 0;
        }
        goto LAB_001065db;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)nbricks != uVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int valid_nifti_brick_list(nifti_image * nim , int nbricks,
                           const int * blist, int disp_error)
{
   int c, nsubs;

   if( !nim ){
      if( disp_error || g_opts.debug > 0 )
         fprintf(stderr,"** valid_nifti_brick_list: missing nifti image\n");
      return 0;
   }

   if( nbricks <= 0 || !blist ){
      if( disp_error || g_opts.debug > 1 )
         fprintf(stderr,"** valid_nifti_brick_list: no brick list to check\n");
      return 0;
   }

   if( nim->dim[0] < 3 ){
      if( disp_error || g_opts.debug > 1 )
         fprintf(stderr,"** cannot read explict brick list from %d-D dataset\n",
                 nim->dim[0]);
      return 0;
   }

   /* nsubs sub-brick is nt*nu*nv*nw */
   for( c = 4, nsubs = 1; c <= nim->dim[0]; c++ )
      nsubs *= nim->dim[c];

   if( nsubs <= 0 ){
      fprintf(stderr,"** VNBL warning: bad dim list (%d,%d,%d,%d)\n",
                     nim->dim[4], nim->dim[5], nim->dim[6], nim->dim[7]);
      return 0;
   }

   for( c = 0; c < nbricks; c++ )
      if( (blist[c] < 0) || (blist[c] >= nsubs) ){
         if( disp_error || g_opts.debug > 1 )
            fprintf(stderr,
               "** volume index %d (#%d) is out of range [0,%d]\n",
               blist[c], c, nsubs-1);
         return 0;
      }

   return 1;  /* all is well */
}